

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  cmExecutionStatus status;
  cmListFileFunction lff;
  allocator local_c9;
  cmMakefile *local_c8;
  cmListFileArgument local_c0;
  cmListFileFunction local_90;
  string local_50 [32];
  
  local_90.super_cmCommandContext.Name._M_dataplus._M_p =
       (pointer)&local_90.super_cmCommandContext.Name.field_2;
  local_90.super_cmCommandContext.Name._M_string_length = 0;
  local_90.super_cmCommandContext.Name.field_2._M_local_buf[0] = '\0';
  local_90.super_cmCommandContext.Line = 0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = (cmMakefile *)arg;
  std::__cxx11::string::assign((char *)&local_90);
  uVar2 = 0;
  uVar3 = (ulong)(uint)numArgs;
  if (numArgs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string(local_50,args[uVar2],&local_c9);
    std::__cxx11::string::string((string *)&local_c0,local_50);
    local_c0.Delim = Quoted;
    local_c0.Line = 0;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
    emplace_back<cmListFileArgument>(&local_90.Arguments,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string(local_50);
  }
  local_c0.Value._M_dataplus._M_p._0_4_ = 0;
  bVar1 = cmMakefile::ExecuteCommand(local_c8,&local_90,(cmExecutionStatus *)&local_c0);
  cmListFileFunction::~cmListFileFunction(&local_90);
  return (uint)bVar1;
}

Assistant:

int CCONV cmExecuteCommand(void *arg, const char *name,
                     int numArgs, const char **args)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for(int i = 0; i < numArgs; ++i)
    {
    // Assume all arguments are quoted.
    lff.Arguments.push_back(
      cmListFileArgument(args[i], cmListFileArgument::Quoted, 0));
    }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff,status);
}